

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Erat.cpp
# Opt level: O3

uint64_t __thiscall primesieve::Erat::getL1CacheSize(Erat *this)

{
  bool bVar1;
  size_t sVar2;
  
  bVar1 = CpuInfo::hasL1Cache((CpuInfo *)cpuInfo);
  if (bVar1) {
    sVar2 = CpuInfo::l1CacheSize((CpuInfo *)cpuInfo);
    if (this->sieveSize_ < sVar2) {
      sVar2 = this->sieveSize_;
    }
    if (0x3fffff < sVar2) {
      sVar2 = 0x400000;
    }
    if (sVar2 < 0x2001) {
      sVar2 = 0x2000;
    }
    return sVar2;
  }
  return this->sieveSize_;
}

Assistant:

uint64_t Erat::getL1CacheSize() const
{
  if (!cpuInfo.hasL1Cache())
    return sieveSize_;

  uint64_t size = cpuInfo.l1CacheSize();
  uint64_t minSize = 8 << 10;
  uint64_t maxSize = 4096 << 10;

  size = std::min(size, sieveSize_);
  size = inBetween(minSize, size, maxSize);

  return size;
}